

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::newData(string *str)

{
  bool bVar1;
  char *pcVar2;
  string *this;
  long local_1a8;
  long value;
  stringstream temp;
  ostream local_190 [376];
  string *local_18;
  string *str_local;
  
  local_18 = str;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
  if (*pcVar2 == '-') {
LAB_0010ab36:
    std::__cxx11::stringstream::stringstream((stringstream *)&value);
    std::operator<<(local_190,(string *)local_18);
    std::istream::operator>>((istream *)&value,&local_1a8);
    this = (string *)operator_new(0x18);
    Integer::Integer((Integer *)this,&local_1a8);
    str_local = this;
    std::__cxx11::stringstream::~stringstream((stringstream *)&value);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 < ':') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if ('/' < *pcVar2) goto LAB_0010ab36;
    }
    bVar1 = std::operator==(local_18,"true");
    if (bVar1) {
      str_local = (string *)trueData;
    }
    else {
      bVar1 = std::operator==(local_18,"false");
      if (bVar1) {
        str_local = (string *)falseData;
      }
      else {
        str_local = (string *)0x0;
      }
    }
  }
  return (Data *)str_local;
}

Assistant:

Data *Data::newData(const std::string &str) {
    if (str[0] == '-' || (str[0] <= '9' && str[0] >= '0')) {
        std::stringstream temp;
        long value;
        temp << str;
        temp >> value;
        return new Integer(value);
    } else if (str == "true") {
        return Data::trueData;
    } else if (str == "false") {
        return Data::falseData;
    } else return NULL;
}